

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwo.cpp
# Opt level: O3

void __thiscall chrono::ChConstraintTwo::ArchiveOUT(ChConstraintTwo *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChConstraintTwo>(marchive);
  ChConstraint::ArchiveOUT(&this->super_ChConstraint,marchive);
  return;
}

Assistant:

void ChConstraintTwo::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintTwo>();

    // serialize the parent class data too
    ChConstraint::ArchiveOUT(marchive);

    // serialize all member data:
    // NOTHING INTERESTING TO SERIALIZE (pointers to variables must be rebound in run-time.)
}